

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgm_controller.cpp
# Opt level: O0

void __thiscall r_exec::AntiPGMController::push_new_signaling_job(AntiPGMController *this)

{
  View *pVVar1;
  _Mem *this_00;
  TimeJob *j;
  long lVar2;
  Code *this_01;
  uint64_t uVar3;
  uint16_t index;
  float fVar4;
  float fVar5;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  Group *host;
  AntiPGMController *this_local;
  
  pVVar1 = Controller::getView((Controller *)this);
  guard._M_device = (mutex_type *)View::get_host(pVVar1);
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->m_hostMutex);
  pVVar1 = Controller::getView((Controller *)this);
  fVar4 = View::get_act(pVVar1);
  fVar5 = Group::get_act_thr((Group *)guard._M_device);
  if (fVar5 < fVar4) {
    fVar4 = Group::get_c_act((Group *)guard._M_device);
    fVar5 = Group::get_c_act_thr((Group *)guard._M_device);
    if (fVar5 < fVar4) {
      fVar4 = Group::get_c_sln((Group *)guard._M_device);
      fVar5 = Group::get_c_sln_thr((Group *)guard._M_device);
      if (fVar5 < fVar4) {
        this_00 = _Mem::Get();
        j = (TimeJob *)operator_new(0x28);
        pVVar1 = (View *)(this->super__PGMController).super_OController.super_Controller.view;
        lVar2 = (*Now)();
        this_01 = Controller::getObject((Controller *)this);
        uVar3 = r_code::Utils::GetTimestamp<r_code::Code>((Utils *)this_01,(Code *)0x4,index);
        AntiPGMSignalingJob::AntiPGMSignalingJob((AntiPGMSignalingJob *)j,pVVar1,lVar2 + uVar3);
        _Mem::pushTimeJob(this_00,j);
      }
    }
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void AntiPGMController::push_new_signaling_job()
{
    Group *host = getView()->get_host();
    std::lock_guard<std::mutex> guard(m_hostMutex);

    if (getView()->get_act() > host->get_act_thr() && // active ipgm.
        host->get_c_act() > host->get_c_act_thr() && // c-active group.
        host->get_c_sln() > host->get_c_sln_thr()) { // c-salient group.
        _Mem::Get()->pushTimeJob(new AntiPGMSignalingJob((r_exec::View*)view, Now() + Utils::GetTimestamp<Code>(getObject(), IPGM_TSC)));
    }
}